

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

Real __thiscall PeleLM::adjust_p_and_divu_for_closed_chamber(PeleLM *this,MultiFab *mac_divu)

{
  bool bVar1;
  MFIter *in_RSI;
  Print *this_00;
  Real scaling;
  Array4<const_double> *theta_1;
  Array4<double> *m_divu;
  Box *bx_1;
  MFIter mfi_1;
  Real Sbar;
  Real thetasum;
  Real Ssum;
  Real pamb_n;
  Real pamb_o;
  Array4<double> *theta;
  Array4<const_double> *T_n;
  Array4<const_double> *T_o;
  Array4<const_double> *rhoY_n;
  Array4<const_double> *rhoY_o;
  Box *bx;
  MFIter mfi;
  MultiFab theta_halft;
  Real dt;
  Real cur_time;
  Real prev_time;
  MultiFab *S_old;
  MultiFab *S_new;
  size_type in_stack_fffffffffffff688;
  char (*x) [51];
  int in_stack_fffffffffffff690;
  int in_stack_fffffffffffff694;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff698;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff6a0;
  StateData *in_stack_fffffffffffff6b0;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffff6b8;
  Print *in_stack_fffffffffffff6c0;
  BoxArray *in_stack_fffffffffffff6c8;
  MultiFab *in_stack_fffffffffffff6d0;
  anon_class_336_7_a40de49f *in_stack_fffffffffffff6d8;
  Box *in_stack_fffffffffffff6e0;
  MFIter *in_stack_fffffffffffff6f0;
  MFIter *this_01;
  undefined1 local_710 [64];
  undefined1 auStack_6d0 [64];
  double local_690;
  double local_688;
  undefined1 local_680 [64];
  undefined1 *local_640;
  undefined1 local_638 [64];
  undefined1 *local_5f8;
  undefined1 local_5ec [28];
  undefined1 *local_5d0;
  MFIter local_5c8;
  double local_568;
  Real local_560;
  Print *local_558;
  undefined1 local_550 [64];
  undefined1 auStack_510 [64];
  undefined1 auStack_4d0 [64];
  undefined1 auStack_490 [64];
  undefined1 auStack_450 [60];
  int in_stack_fffffffffffffbec;
  MultiFab *in_stack_fffffffffffffbf0;
  PeleLM *in_stack_fffffffffffffbf8;
  undefined1 local_3f0 [64];
  undefined1 *local_3b0;
  undefined1 local_3a8 [64];
  undefined1 *local_368;
  undefined1 local_360 [64];
  undefined1 *local_320;
  undefined1 local_318 [64];
  undefined1 *local_2d8;
  undefined1 local_2d0 [64];
  undefined1 *local_290;
  undefined1 local_284 [28];
  undefined1 *local_268;
  MFIter local_260;
  char local_1f0 [440];
  double local_38;
  Real local_30;
  Real local_28;
  MultiFab *local_20;
  MultiFab *local_18;
  MFIter *local_10;
  
  local_10 = in_RSI;
  local_18 = amrex::AmrLevel::get_new_data
                       ((AmrLevel *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                        (int)(in_stack_fffffffffffff688 >> 0x20));
  local_20 = amrex::AmrLevel::get_old_data
                       ((AmrLevel *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                        (int)(in_stack_fffffffffffff688 >> 0x20));
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
             CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),in_stack_fffffffffffff688
            );
  local_28 = amrex::StateData::prevTime((StateData *)in_stack_fffffffffffff6a0);
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
             CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),in_stack_fffffffffffff688
            );
  local_30 = amrex::StateData::curTime(in_stack_fffffffffffff6b0);
  local_38 = local_30 - local_28;
  local_1f0[0x18] = '\0';
  local_1f0[0x19] = '\0';
  local_1f0[0x1a] = '\0';
  local_1f0[0x1b] = '\0';
  local_1f0[0x1c] = '\0';
  local_1f0[0x1d] = '\0';
  local_1f0[0x1e] = '\0';
  local_1f0[0x1f] = '\0';
  local_1f0[0x20] = '\0';
  local_1f0[0x21] = '\0';
  local_1f0[0x22] = '\0';
  local_1f0[0x23] = '\0';
  local_1f0[0x24] = '\0';
  local_1f0[0x25] = '\0';
  local_1f0[0x26] = '\0';
  local_1f0[0x27] = '\0';
  local_1f0[8] = '\0';
  local_1f0[9] = '\0';
  local_1f0[10] = '\0';
  local_1f0[0xb] = '\0';
  local_1f0[0xc] = '\0';
  local_1f0[0xd] = '\0';
  local_1f0[0xe] = '\0';
  local_1f0[0xf] = '\0';
  local_1f0[0x10] = '\0';
  local_1f0[0x11] = '\0';
  local_1f0[0x12] = '\0';
  local_1f0[0x13] = '\0';
  local_1f0[0x14] = '\0';
  local_1f0[0x15] = '\0';
  local_1f0[0x16] = '\0';
  local_1f0[0x17] = '\0';
  local_1f0[0x28] = '\0';
  local_1f0[0x29] = '\0';
  local_1f0[0x2a] = '\0';
  local_1f0[0x2b] = '\0';
  local_1f0[0x2c] = '\0';
  local_1f0[0x2d] = '\0';
  local_1f0[0x2e] = '\0';
  local_1f0[0x2f] = '\0';
  amrex::MFInfo::MFInfo((MFInfo *)0x5156c8);
  local_1f0[0] = '\0';
  local_1f0[1] = '\0';
  local_1f0[2] = '\0';
  local_1f0[3] = '\0';
  local_1f0[4] = '\0';
  local_1f0[5] = '\0';
  local_1f0[6] = '\0';
  local_1f0[7] = '\0';
  x = (char (*) [51])local_1f0;
  amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)
             CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
             (DistributionMapping *)in_stack_fffffffffffff6c0,
             (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20),(int)in_stack_fffffffffffff6b8,
             (MFInfo *)in_stack_fffffffffffff6b0,
             (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff6e0);
  amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x515738);
  amrex::MFInfo::~MFInfo((MFInfo *)0x515745);
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter
            ((MFIter *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,
             SUB81((ulong)in_stack_fffffffffffff6b0 >> 0x38,0));
  while( true ) {
    bVar1 = amrex::MFIter::isValid(&local_260);
    do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffff6b0 >> 0x38);
    if (!bVar1) break;
    amrex::MFIter::tilebox(in_stack_fffffffffffff6f0);
    local_268 = local_284;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff6a0,(MFIter *)in_stack_fffffffffffff698,
               in_stack_fffffffffffff694);
    local_290 = local_2d0;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff6a0,(MFIter *)in_stack_fffffffffffff698,
               in_stack_fffffffffffff694);
    local_2d8 = local_318;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff6a0,(MFIter *)in_stack_fffffffffffff698,
               in_stack_fffffffffffff694);
    local_320 = local_360;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff6a0,(MFIter *)in_stack_fffffffffffff698,
               in_stack_fffffffffffff694);
    local_368 = local_3a8;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff698,
               (MFIter *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
    in_stack_fffffffffffffbf8 = (PeleLM *)p_amb_new;
    in_stack_fffffffffffffbf0 = (MultiFab *)p_amb_old;
    local_3b0 = local_3f0;
    memcpy(local_550,local_290,0x3c);
    memcpy(auStack_510,local_2d8,0x3c);
    memcpy(auStack_4d0,local_320,0x3c);
    memcpy(auStack_490,local_368,0x3c);
    memcpy(auStack_450,local_3b0,0x3c);
    amrex::ParallelFor<PeleLM::adjust_p_and_divu_for_closed_chamber(amrex::MultiFab&)::__0>
              (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
    amrex::MFIter::operator++(&local_260);
  }
  amrex::MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
  this_00 = (Print *)getMFsum(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                              in_stack_fffffffffffffbec);
  local_558 = this_00;
  local_560 = getMFsum(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec
                      );
  local_568 = (double)local_558 / lev0cellCount;
  thetabar = local_560 / lev0cellCount;
  amrex::MultiFab::plus
            ((MultiFab *)in_stack_fffffffffffff6a0,(Real)in_stack_fffffffffffff698,
             in_stack_fffffffffffff694,in_stack_fffffffffffff690,(int)((ulong)x >> 0x20));
  amrex::MultiFab::plus
            ((MultiFab *)in_stack_fffffffffffff6a0,(Real)in_stack_fffffffffffff698,
             in_stack_fffffffffffff694,in_stack_fffffffffffff690,(int)((ulong)x >> 0x20));
  p_amb_new = local_38 * (local_568 / thetabar) + p_amb_old;
  dp0dt = local_568 / thetabar;
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter
            ((MFIter *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,(bool)do_tiling_);
  this_01 = local_10;
  while( true ) {
    bVar1 = amrex::MFIter::isValid(&local_5c8);
    if (!bVar1) break;
    amrex::MFIter::tilebox(this_01);
    local_5d0 = local_5ec;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff698,
               (MFIter *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
    local_5f8 = local_638;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff698,
               (MFIter *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
    local_640 = local_680;
    local_688 = local_568 / thetabar;
    memcpy(local_710,local_5f8,0x3c);
    memcpy(auStack_6d0,local_640,0x3c);
    local_690 = local_688;
    amrex::ParallelFor<PeleLM::adjust_p_and_divu_for_closed_chamber(amrex::MultiFab&)::__1>
              (in_stack_fffffffffffff6e0,(anon_class_136_3_ca7d1059 *)in_stack_fffffffffffff6d8);
    amrex::MFIter::operator++(&local_5c8);
  }
  amrex::MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
  if (NavierStokesBase::verbose != 0) {
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff6c0,(ostream *)in_stack_fffffffffffff6b8);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),x);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),(double *)x);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               (char (*) [2])x);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),(double *)x);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               (char (*) [2])x);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),(double *)x);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               (char (*) [2])x);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),(double *)x);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)x);
    amrex::Print::~Print(this_00);
  }
  amrex::MultiFab::~MultiFab((MultiFab *)0x515e37);
  return local_568;
}

Assistant:

Real
PeleLM::adjust_p_and_divu_for_closed_chamber(MultiFab& mac_divu)
{
   const MultiFab& S_new = get_new_data(State_Type);
   const MultiFab& S_old = get_old_data(State_Type);

   const Real prev_time = state[State_Type].prevTime();
   const Real cur_time  = state[State_Type].curTime();
   const Real dt = cur_time - prev_time;

   // used for closed chamber algorithm
   MultiFab theta_halft(grids,dmap,1,nGrowAdvForcing);

   // compute old, new, and time-centered theta = 1 / (gamma P)
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S_old,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& rhoY_o  = S_old.const_array(mfi,first_spec);
      auto const& rhoY_n  = S_new.const_array(mfi,first_spec);
      auto const& T_o     = S_old.const_array(mfi,Temp);
      auto const& T_n     = S_new.const_array(mfi,Temp);
      auto const& theta   = theta_halft.array(mfi);
      amrex::Real pamb_o  = p_amb_old;
      amrex::Real pamb_n  = p_amb_new;

      amrex::ParallelFor(bx, [rhoY_o, rhoY_n, T_o, T_n, theta, pamb_o, pamb_n]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         amrex::Real gammaInv_o = getGammaInv( i, j, k, rhoY_o, T_o );
         amrex::Real gammaInv_n = getGammaInv( i, j, k, rhoY_n, T_n );
         theta(i,j,k) = 0.5 * ( gammaInv_o/pamb_o + gammaInv_n/pamb_n );
      });
   }

   // Get S sum and theta sum
   Real Ssum = getMFsum(mac_divu,0);
   Real thetasum = getMFsum(theta_halft,0);

   // Normalize by cell count / uncovered cell count if EB
   Real Sbar = Ssum/lev0cellCount;
   thetabar  = thetasum/lev0cellCount;

   // subtract mean from mac_divu and theta_nph
   mac_divu.plus(-Sbar,0,1);
   theta_halft.plus(-thetabar,0,1);

   p_amb_new = p_amb_old + dt*(Sbar/thetabar);
   dp0dt = Sbar/thetabar;

   // update mac rhs by adding delta_theta * (Sbar / thetabar)
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(mac_divu,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& m_divu  = mac_divu.array(mfi);
      auto const& theta   = theta_halft.const_array(mfi);
      amrex::Real scaling = Sbar/thetabar;

      amrex::ParallelFor(bx, [m_divu, theta, scaling]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         m_divu(i,j,k) -= theta(i,j,k) * scaling;
      });
   }

   if (verbose) {
      amrex::Print() << "level 0: prev_time, p_amb_old, p_amb_new, delta = "
                     << prev_time << " " << p_amb_old << " " << p_amb_new << " "
                     << p_amb_new-p_amb_old << std::endl;
   }

   return Sbar;
}